

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::SetI2P(CNetAddr *this,string *addr)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  string_view str;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  long in_RDI;
  long in_FS_OFFSET;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> address_bytes;
  string b32_padded;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined6 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffed8;
  byte local_111;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  bool local_a9;
  string_view in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [2];
  uchar local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_stack_fffffffffffffea8);
  local_111 = 1;
  if (sVar2 == 0x3c) {
    in_stack_fffffffffffffed8._M_current = local_48;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffed7,
                        CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
               (size_type)in_stack_fffffffffffffec8,(size_type)in_stack_fffffffffffffec0);
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffec8);
    str._M_len._4_4_ = in_stack_ffffffffffffff04;
    str._M_len._0_4_ = in_stack_ffffffffffffff00;
    str._M_str = in_stack_ffffffffffffff08;
    ToLower_abi_cxx11_(str);
    in_stack_fffffffffffffed7 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                         (char *)in_stack_fffffffffffffeb0);
    local_111 = in_stack_fffffffffffffed7 ^ 0xff;
    std::__cxx11::string::~string(in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(in_stack_fffffffffffffea8);
  }
  if ((local_111 & 1) != 0) {
    local_a9 = false;
    goto LAB_0197d1df;
  }
  this_00 = local_88;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffed7,CONCAT16(local_111,in_stack_fffffffffffffed0)),
             (size_type)this_00,(size_type)in_stack_fffffffffffffec0);
  std::operator+(in_stack_fffffffffffffec0,
                 (char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  std::__cxx11::string::~string(in_stack_fffffffffffffea8);
  std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
  DecodeBase32(in_stack_ffffffffffffff60);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                     in_stack_fffffffffffffea8);
  if (bVar1) {
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator->
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffea8);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffea8);
    if (sVar3 != 0x20) goto LAB_0197d0d9;
    *(undefined4 *)(in_RDI + 0x18) = 4;
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator->
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffea8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffeb0);
    std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator->
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               in_stack_fffffffffffffea8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffeb0);
    last._M_current._6_1_ = local_111;
    last._M_current._0_6_ = in_stack_fffffffffffffed0;
    last._M_current._7_1_ = in_stack_fffffffffffffed7;
    prevector<16U,_unsigned_char,_unsigned_int,_int>::
    assign<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
               in_stack_fffffffffffffed8,last);
    local_a9 = true;
  }
  else {
LAB_0197d0d9:
    local_a9 = false;
  }
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             in_stack_fffffffffffffea8);
  std::__cxx11::string::~string(in_stack_fffffffffffffea8);
LAB_0197d1df:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_a9;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::SetI2P(const std::string& addr)
{
    // I2P addresses that we support consist of 52 base32 characters + ".b32.i2p".
    static constexpr size_t b32_len{52};
    static const char* suffix{".b32.i2p"};
    static constexpr size_t suffix_len{8};

    if (addr.size() != b32_len + suffix_len || ToLower(addr.substr(b32_len)) != suffix) {
        return false;
    }

    // Remove the ".b32.i2p" suffix and pad to a multiple of 8 chars, so DecodeBase32()
    // can decode it.
    const std::string b32_padded = addr.substr(0, b32_len) + "====";

    auto address_bytes = DecodeBase32(b32_padded);

    if (!address_bytes || address_bytes->size() != ADDR_I2P_SIZE) {
        return false;
    }

    m_net = NET_I2P;
    m_addr.assign(address_bytes->begin(), address_bytes->end());

    return true;
}